

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_L.c
# Opt level: O1

void test_L(void)

{
  wchar_t wVar1;
  
  extract_reference_file("test_basic.zip");
  wVar1 = systemf("%s -L %s >test.out 2>test.err",testprog,"test_basic.zip");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_L.c"
                      ,L'\x11',0,"0",(long)wVar1,"r",(void *)0x0);
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_L.c"
             ,L'\x12',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_L.c"
             ,L'\x13',"test.err");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_L.c"
             ,L'\x15',"contents a\n","test_basic/a");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_L.c"
             ,L'\x16',"contents b\n","test_basic/b");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_L.c"
             ,L'\x17',"contents c\n","test_basic/c");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_L.c"
             ,L'\x18',"contents CAPS\n","test_basic/caps");
  return;
}

Assistant:

DEFINE_TEST(test_L)
{
	const char *reffile = "test_basic.zip";
	int r;

	extract_reference_file(reffile);
	r = systemf("%s -L %s >test.out 2>test.err", testprog, reffile);
	assertEqualInt(0, r);
	assertNonEmptyFile("test.out");
	assertEmptyFile("test.err");

	assertTextFileContents("contents a\n", "test_basic/a");
	assertTextFileContents("contents b\n", "test_basic/b");
	assertTextFileContents("contents c\n", "test_basic/c");
	assertTextFileContents("contents CAPS\n", "test_basic/caps");
}